

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int get_active_cq_level(RATE_CONTROL *rc,PRIMARY_RATE_CONTROL *p_rc,AV1EncoderConfig *oxcf,
                       int intra_only,aom_superres_mode superres_mode,int superres_denom)

{
  int iVar1;
  int active_cq_level;
  int iVar2;
  double dVar3;
  int in_stack_00000008;
  
  iVar1 = (int)oxcf;
  if ((intra_only & 0xfffffffeU) == 2) {
    if (in_stack_00000008 != 8 && superres_denom - 3U < 2) {
      iVar2 = 0;
      if (superres_mode != AOM_SUPERRES_NONE) {
        iVar2 = (uint)(rc->frames_to_key < 2) * 2 + -2;
      }
      iVar2 = (in_stack_00000008 + -8) * iVar2 + iVar1;
      iVar1 = 0;
      if (0 < iVar2) {
        iVar1 = iVar2;
      }
    }
    if (((intra_only == 2) && (0 < p_rc->total_target_bits)) &&
       (dVar3 = (double)p_rc->total_actual_bits / (double)p_rc->total_target_bits, dVar3 < 0.1)) {
      iVar1 = (int)(((double)iVar1 * dVar3) / 0.1);
    }
  }
  return iVar1;
}

Assistant:

static int get_active_cq_level(const RATE_CONTROL *rc,
                               const PRIMARY_RATE_CONTROL *p_rc,
                               const AV1EncoderConfig *const oxcf,
                               int intra_only, aom_superres_mode superres_mode,
                               int superres_denom) {
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  static const double cq_adjust_threshold = 0.1;
  int active_cq_level = rc_cfg->cq_level;
  if (rc_cfg->mode == AOM_CQ || rc_cfg->mode == AOM_Q) {
    if ((superres_mode == AOM_SUPERRES_QTHRESH ||
         superres_mode == AOM_SUPERRES_AUTO) &&
        superres_denom != SCALE_NUMERATOR) {
      int mult = SUPERRES_QADJ_PER_DENOM_KEYFRAME_SOLO;
      if (intra_only && rc->frames_to_key <= 1) {
        mult = 0;
      } else if (intra_only) {
        mult = SUPERRES_QADJ_PER_DENOM_KEYFRAME;
      } else {
        mult = SUPERRES_QADJ_PER_DENOM_ARFFRAME;
      }
      active_cq_level = AOMMAX(
          active_cq_level - ((superres_denom - SCALE_NUMERATOR) * mult), 0);
    }
  }
  if (rc_cfg->mode == AOM_CQ && p_rc->total_target_bits > 0) {
    const double x = (double)p_rc->total_actual_bits / p_rc->total_target_bits;
    if (x < cq_adjust_threshold) {
      active_cq_level = (int)(active_cq_level * x / cq_adjust_threshold);
    }
  }
  return active_cq_level;
}